

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

VkSpecializationInfo * __thiscall
Fossilize::StateRecorder::Impl::copy<VkSpecializationInfo>
          (Impl *this,VkSpecializationInfo *src,size_t count,ScratchAllocator *alloc)

{
  VkSpecializationInfo *pVVar1;
  
  if (count != 0) {
    pVVar1 = ScratchAllocator::allocate_n<VkSpecializationInfo>(alloc,count);
    if (pVVar1 != (VkSpecializationInfo *)0x0) {
      pVVar1 = (VkSpecializationInfo *)memmove(pVVar1,src,count << 5);
      return pVVar1;
    }
  }
  return (VkSpecializationInfo *)0x0;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}